

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O1

gost_cipher_info * get_encryption_params(ASN1_OBJECT *obj)

{
  gost_cipher_info *pgVar1;
  char *s;
  undefined4 extraout_var;
  gost_cipher_info *pgVar2;
  gost_cipher_info *pgVar3;
  int unaff_EBX;
  bool bVar4;
  
  if (obj == (ASN1_OBJECT *)0x0) {
    s = get_gost_engine_param(0);
    if ((s == (char *)0x0) || (*s == '\0')) {
      for (pgVar2 = gost_cipher_list; pgVar2->nid != 0; pgVar2 = pgVar2 + 1) {
        if (pgVar2->nid == 0x3eb) goto LAB_00117a78;
      }
      pgVar2 = gost_cipher_list;
LAB_00117a78:
      bVar4 = false;
    }
    else {
      unaff_EBX = OBJ_txt2nid(s);
      pgVar2 = (gost_cipher_info *)CONCAT44(extraout_var,unaff_EBX);
      if (unaff_EBX == 0) {
        ERR_GOST_error(0x67,0x6f,
                       "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_crypt.c"
                       ,0x17f);
        unaff_EBX = 0;
        ERR_add_error_data(3,"Unsupported CRYPT_PARAMS=\'",s);
        pgVar2 = (gost_cipher_info *)0x0;
        bVar4 = false;
      }
      else {
        bVar4 = true;
      }
    }
    if (!bVar4) {
      return pgVar2;
    }
  }
  else {
    unaff_EBX = OBJ_obj2nid((ASN1_OBJECT *)obj);
  }
  bVar4 = gost_cipher_list[0].sblock == (gost_subst_block *)0x0;
  if (!bVar4) {
    if (gost_cipher_list[0].nid == unaff_EBX) {
      pgVar3 = gost_cipher_list;
    }
    else {
      pgVar2 = gost_cipher_list;
      do {
        bVar4 = pgVar2[1].sblock == (gost_subst_block *)0x0;
        if (bVar4) goto LAB_00117abd;
        pgVar3 = pgVar2 + 1;
        pgVar1 = pgVar2 + 1;
        pgVar2 = pgVar3;
      } while (pgVar1->nid != unaff_EBX);
    }
    if (!bVar4) {
      return pgVar3;
    }
  }
LAB_00117abd:
  ERR_GOST_error(0x67,0x6e,
                 "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_crypt.c"
                 ,0x18a);
  return (gost_cipher_info *)0x0;
}

Assistant:

const struct gost_cipher_info *get_encryption_params(ASN1_OBJECT *obj)
{
    int nid;
    struct gost_cipher_info *param;
    if (!obj) {
        const char *params = get_gost_engine_param(GOST_PARAM_CRYPT_PARAMS);
        if (!params || !strlen(params)) {
            int i;
            for (i = 0; gost_cipher_list[i].nid != NID_undef; i++)
                if (gost_cipher_list[i].nid == NID_id_tc26_gost_28147_param_Z)
                    return &gost_cipher_list[i];
            return &gost_cipher_list[0];
        }

        nid = OBJ_txt2nid(params);
        if (nid == NID_undef) {
            GOSTerr(GOST_F_GET_ENCRYPTION_PARAMS,
                    GOST_R_INVALID_CIPHER_PARAM_OID);
            ERR_add_error_data(3, "Unsupported CRYPT_PARAMS='",
                params, "' specified in environment or in config");
            return NULL;
        }
    } else {
        nid = OBJ_obj2nid(obj);
    }
    for (param = gost_cipher_list; param->sblock != NULL && param->nid != nid;
         param++) ;
    if (!param->sblock) {
        GOSTerr(GOST_F_GET_ENCRYPTION_PARAMS, GOST_R_INVALID_CIPHER_PARAMS);
        return NULL;
    }
    return param;
}